

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O1

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::RenderDataPiece
          (AnyWriter *this,StringPiece name,DataPiece *value)

{
  ProtoStreamObjectWriter *pPVar1;
  StringPiece value_00;
  int iVar2;
  size_t __n;
  char *__s1;
  stringpiece_ssize_type len;
  StringPiece value_01;
  StringPiece type_name;
  StringPiece type_name_00;
  StringPiece local_c0;
  StringPiece local_b0;
  undefined1 local_a0 [8];
  Status status;
  _Alloc_hider local_50;
  char local_40 [16];
  
  __n = name.length_;
  __s1 = name.ptr_;
  if ((__n == 5 &&
       ((this->ow_)._M_t.
        super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
        .super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>.
        _M_head_impl == (ProtoStreamObjectWriter *)0x0 && this->depth_ == 0)) &&
     ((__s1 == "@type" || (iVar2 = bcmp(__s1,"@type",__n), iVar2 == 0)))) {
    StartAny(this,value);
    return;
  }
  pPVar1 = (this->ow_)._M_t.
           super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
           .
           super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>
           ._M_head_impl;
  if (pPVar1 == (ProtoStreamObjectWriter *)0x0) {
    Event::Event((Event *)local_a0,name,value);
    std::
    vector<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event,_std::allocator<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>_>
    ::emplace_back<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>
              (&this->uninterpreted_events_,(Event *)local_a0);
    if (local_50._M_p != local_40) {
      operator_delete(local_50._M_p);
    }
  }
  else {
    if ((this->depth_ != 0) || (this->is_well_known_type_ != true)) {
      (**(code **)(*(long *)&(pPVar1->super_ProtoWriter).super_StructuredObjectWriter + 0x90))
                (pPVar1,__s1,__n,value);
      return;
    }
    if (((__n != 5) || ((__s1 != "value" && (iVar2 = bcmp(__s1,"value",5), iVar2 != 0)))) &&
       (this->invalid_ == false)) {
      value_01.length_ = 0x2c;
      value_01.ptr_ = "Expect a \"value\" field for well-known types.";
      type_name.length_ = 3;
      type_name.ptr_ = "Any";
      ProtoWriter::InvalidValue(&this->parent_->super_ProtoWriter,type_name,value_01);
      this->invalid_ = true;
    }
    if (this->well_known_type_render_ == (TypeRenderer *)0x0) {
      if (value->type_ == TYPE_NULL) {
        return;
      }
      if (this->invalid_ != false) {
        return;
      }
      pPVar1 = this->parent_;
      StringPiece::StringPiece(&local_c0,"Any");
      StringPiece::StringPiece(&local_b0,"Expect a JSON object.");
      ProtoWriter::InvalidValue(&pPVar1->super_ProtoWriter,local_c0,local_b0);
      this->invalid_ = true;
      return;
    }
    ProtoWriter::StartObject
              (&((this->ow_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
                 .
                 super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>
                ._M_head_impl)->super_ProtoWriter,(StringPiece)ZEXT816(0x352cac));
    (**this->well_known_type_render_)
              ((Status *)local_a0,
               (this->ow_)._M_t.
               super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
               .
               super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>
               ._M_head_impl,value);
    if (local_a0._0_4_ != START_OBJECT) {
      pPVar1 = (this->ow_)._M_t.
               super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
               .
               super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>
               ._M_head_impl;
      value_00.length_ = (stringpiece_ssize_type)status.error_message_._M_dataplus._M_p;
      value_00.ptr_ = (char *)status._0_8_;
      if ((long)status.error_message_._M_dataplus._M_p < 0) {
        StringPiece::LogFatalSizeTooBig
                  ((size_t)status.error_message_._M_dataplus._M_p,"size_t to int conversion");
      }
      type_name_00.length_ = 3;
      type_name_00.ptr_ = "Any";
      ProtoWriter::InvalidValue(&pPVar1->super_ProtoWriter,type_name_00,value_00);
    }
    ProtoWriter::EndObject
              (&((this->ow_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
                 .
                 super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>
                ._M_head_impl)->super_ProtoWriter);
  }
  if ((size_type *)status._0_8_ != &status.error_message_._M_string_length) {
    operator_delete((void *)status._0_8_);
  }
  return;
}

Assistant:

void ProtoStreamObjectWriter::AnyWriter::RenderDataPiece(
    StringPiece name, const DataPiece& value) {
  // Start an Any only at depth_ 0. Other RenderDataPiece calls with "@type"
  // should go to the contained ow_ as they indicate nested Anys.
  if (depth_ == 0 && ow_ == nullptr && name == "@type") {
    StartAny(value);
  } else if (ow_ == nullptr) {
    // Save data before the "@type" field.
    uninterpreted_events_.push_back(Event(name, value));
  } else if (depth_ == 0 && is_well_known_type_) {
    if (name != "value" && !invalid_) {
      parent_->InvalidValue("Any",
                            "Expect a \"value\" field for well-known types.");
      invalid_ = true;
    }
    if (well_known_type_render_ == nullptr) {
      // Only Any and Struct don't have a special type render but both of
      // them expect a JSON object (i.e., a StartObject() call).
      if (value.type() != DataPiece::TYPE_NULL && !invalid_) {
        parent_->InvalidValue("Any", "Expect a JSON object.");
        invalid_ = true;
      }
    } else {
      ow_->ProtoWriter::StartObject("");
      Status status = (*well_known_type_render_)(ow_.get(), value);
      if (!status.ok()) ow_->InvalidValue("Any", status.message());
      ow_->ProtoWriter::EndObject();
    }
  } else {
    ow_->RenderDataPiece(name, value);
  }
}